

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpTools.cpp
# Opt level: O2

void __thiscall UdpTools::UdpTools(UdpTools *this,string *iface)

{
  int iVar1;
  invalid_argument *this_00;
  UdpTools *this_01;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interfacesOnSystem;
  
  plVar2 = &interfacesOnSystem;
  plVar3 = &interfacesOnSystem;
  this->_vptr_UdpTools = (_func_int **)&PTR__UdpTools_00105d90;
  (this->specifiedInterface)._M_dataplus._M_p = (pointer)&(this->specifiedInterface).field_2;
  (this->specifiedInterface)._M_string_length = 0;
  (this->specifiedInterface).field_2._M_local_buf[0] = '\0';
  this->stopReceiveThread = false;
  this_01 = (UdpTools *)iface;
  std::__cxx11::string::_M_assign((string *)&this->specifiedInterface);
  getInterfaces_abi_cxx11_(&interfacesOnSystem,this_01);
  do {
    plVar2 = *(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               **)plVar2;
    if (plVar2 == &interfacesOnSystem) {
      printf("Given interface name %s was not found!\n",(iface->_M_dataplus)._M_p);
      printf("Detected interfaces: ");
      while (plVar3 = *(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        **)plVar3, plVar3 != &interfacesOnSystem) {
        printf("\t\t %s\n",*(undefined8 *)((long)plVar3 + 0x10));
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Could not detect iface name");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar1 = std::__cxx11::string::compare((string *)((long)plVar2 + 0x10));
  } while (iVar1 != 0);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&interfacesOnSystem.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return;
}

Assistant:

UdpTools::UdpTools(std::string iface)
{
	stopReceiveThread = false;
	specifiedInterface = iface;
	std::list<std::string> interfacesOnSystem = getInterfaces();
	std::list<std::string>::iterator it;

	bool ifacefound = false;
	for(it = interfacesOnSystem.begin(); it != interfacesOnSystem.end(); it++)
	{
		if(it->compare(iface) == 0)
		{
			ifacefound = true;
			break;
		}
	}

	if(!ifacefound)
	{
		printf("Given interface name %s was not found!\n", iface.c_str());
		printf("Detected interfaces: ");
		for(it = interfacesOnSystem.begin(); it != interfacesOnSystem.end(); it++)
		{
			printf("\t\t %s\n", it->c_str());
		}
		throw std::invalid_argument("Could not detect iface name");
	}

}